

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O1

void __thiscall sf::Shape::updateOutline(Shape *this)

{
  VertexArray *this_00;
  VertexArray *this_01;
  Vector2f VVar1;
  undefined8 uVar2;
  size_t sVar3;
  Vertex *pVVar4;
  Vertex *pVVar5;
  size_t sVar6;
  size_t index;
  size_t index_00;
  size_t index_01;
  long lVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar21;
  float fVar23;
  undefined1 auVar22 [16];
  FloatRect FVar24;
  float local_c8;
  float fStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  Vector2f local_a8;
  undefined8 local_98;
  float local_68;
  float fStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined1 auVar20 [16];
  
  if ((this->m_outlineThickness != 0.0) || (NAN(this->m_outlineThickness))) {
    this_00 = &this->m_vertices;
    sVar3 = VertexArray::getVertexCount(this_00);
    this_01 = &this->m_outlineVertices;
    VertexArray::resize(this_01,sVar3 * 2 - 2);
    sVar3 = sVar3 - 2;
    if (sVar3 != 0) {
      index_01 = 1;
      lVar7 = 0;
      sVar6 = 0;
      do {
        index = sVar6 + 1;
        bVar8 = lVar7 == 0;
        lVar7 = lVar7 + -1;
        index_00 = sVar6;
        if (bVar8) {
          index_00 = sVar3;
        }
        pVVar4 = VertexArray::operator[](this_00,index_00);
        uVar2 = *(undefined8 *)&(pVVar4->position).y;
        fVar11 = (pVVar4->position).x;
        pVVar4 = VertexArray::operator[](this_00,index);
        VVar1 = pVVar4->position;
        pVVar4 = VertexArray::operator[](this_00,sVar6 + 2);
        local_c8 = (float)uVar2;
        fStack_c4 = (float)((ulong)uVar2 >> 0x20);
        fVar21 = (pVVar4->position).x;
        uVar2 = *(undefined8 *)&(pVVar4->position).y;
        local_a8.x = VVar1.x;
        local_a8.y = VVar1.y;
        auVar14._0_4_ = local_c8 - local_a8.y;
        auVar14._4_4_ = local_a8.x - fVar11;
        auVar14._8_4_ = fStack_c4 - local_a8.y;
        auVar14._12_4_ = local_a8.y - local_a8.y;
        fVar11 = auVar14._0_4_ * auVar14._0_4_ + auVar14._4_4_ * auVar14._4_4_;
        if (fVar11 < 0.0) {
          fVar11 = sqrtf(fVar11);
        }
        else {
          fVar11 = SQRT(fVar11);
        }
        auVar13._4_4_ = fVar11;
        auVar13._0_4_ = fVar11;
        auVar13._8_4_ = fVar11;
        auVar13._12_4_ = fVar11;
        auVar13 = divps(auVar14,auVar13);
        if ((fVar11 == 0.0) && (!NAN(fVar11))) {
          auVar13 = auVar14;
        }
        auVar16._0_4_ = local_a8.y - (float)uVar2;
        auVar16._4_4_ = fVar21 - local_a8.x;
        auVar16._8_4_ = local_a8.y - (float)((ulong)uVar2 >> 0x20);
        auVar16._12_4_ = local_a8.y - local_a8.y;
        fVar11 = auVar16._0_4_ * auVar16._0_4_ + auVar16._4_4_ * auVar16._4_4_;
        if (fVar11 < 0.0) {
          fVar11 = sqrtf(fVar11);
        }
        else {
          fVar11 = SQRT(fVar11);
        }
        auVar12._4_4_ = fVar11;
        auVar12._0_4_ = fVar11;
        auVar12._8_4_ = fVar11;
        auVar12._12_4_ = fVar11;
        auVar14 = divps(auVar16,auVar12);
        if ((fVar11 == 0.0) && (!NAN(fVar11))) {
          auVar14 = auVar16;
        }
        pVVar4 = VertexArray::operator[](this_00,0);
        local_68 = auVar13._0_4_;
        fStack_64 = auVar13._4_4_;
        uStack_60 = auVar13._8_4_;
        uStack_5c = auVar13._12_4_;
        local_98 = auVar13._0_8_ ^ 0x8000000080000000;
        fVar11 = (pVVar4->position).x;
        fVar21 = (pVVar4->position).y;
        pVVar4 = VertexArray::operator[](this_00,0);
        local_c8 = auVar14._0_4_;
        fStack_c4 = auVar14._4_4_;
        uStack_c0 = auVar14._8_4_;
        uStack_bc = auVar14._12_4_;
        uVar9 = -(uint)(0.0 < local_c8 * ((pVVar4->position).x - local_a8.x) +
                              fStack_c4 * ((pVVar4->position).y - local_a8.y));
        uVar10 = -(uint)(0.0 < local_68 * (fVar11 - local_a8.x) + fStack_64 * (fVar21 - local_a8.y))
        ;
        auVar17._0_4_ = (uint)local_98 & uVar10;
        auVar17._4_4_ = local_98._4_4_ & uVar10;
        auVar17._8_4_ = (uStack_60 ^ 0x80000000) & uVar10;
        auVar17._12_4_ = (uStack_5c ^ 0x80000000) & uVar10;
        auVar15._0_4_ = ~uVar10 & (uint)local_68;
        auVar15._4_4_ = ~uVar10 & (uint)fStack_64;
        auVar15._8_4_ = ~uVar10 & uStack_60;
        auVar15._12_4_ = ~uVar10 & uStack_5c;
        auVar15 = auVar15 | auVar17;
        fVar21 = (float)((uint)-local_c8 & uVar9 | ~uVar9 & (uint)local_c8);
        fVar23 = (float)((uint)-fStack_c4 & uVar9 | ~uVar9 & (uint)fStack_c4);
        fVar11 = auVar15._4_4_;
        auVar18._0_4_ = auVar15._0_4_ * fVar21 + fVar11 * fVar23 + 1.0;
        auVar18._4_12_ = auVar15._4_12_;
        auVar22._0_4_ = fVar21 + auVar15._0_4_;
        auVar22._4_4_ = fVar23 + fVar11;
        auVar22._8_4_ =
             (float)((uStack_c0 ^ 0x80000000) & uVar10 | ~uVar10 & uStack_c0) + auVar15._8_4_;
        auVar22._12_4_ =
             (float)((uStack_bc ^ 0x80000000) & uVar10 | ~uVar10 & uStack_bc) + auVar15._12_4_;
        auVar20._0_8_ = auVar18._0_8_;
        auVar20._8_4_ = fVar11;
        auVar20._12_4_ = fVar11;
        auVar19._8_8_ = auVar20._8_8_;
        auVar19._4_4_ = auVar18._0_4_;
        auVar19._0_4_ = auVar18._0_4_;
        auVar14 = divps(auVar22,auVar19);
        pVVar4 = VertexArray::operator[](this_01,index_01 - 1);
        (pVVar4->position).x = local_a8.x;
        (pVVar4->position).y = local_a8.y;
        local_c8 = auVar14._0_4_;
        fStack_c4 = auVar14._4_4_;
        local_a8.y = this->m_outlineThickness * fStack_c4 + local_a8.y;
        local_a8.x = this->m_outlineThickness * local_c8 + local_a8.x;
        pVVar4 = VertexArray::operator[](this_01,index_01);
        pVVar4->position = local_a8;
        index_01 = index_01 + 2;
        sVar6 = index;
      } while (index != sVar3);
    }
    pVVar4 = VertexArray::operator[](this_01,0);
    pVVar5 = VertexArray::operator[](this_01,sVar3 * 2);
    pVVar5->position = pVVar4->position;
    pVVar4 = VertexArray::operator[](this_01,1);
    pVVar5 = VertexArray::operator[](this_01,sVar3 * 2 + 1);
    pVVar5->position = pVVar4->position;
    updateOutlineColors(this);
    FVar24 = VertexArray::getBounds(this_01);
    this->m_bounds = FVar24;
  }
  else {
    VertexArray::clear(&this->m_outlineVertices);
    fVar11 = (this->m_insideBounds).top;
    fVar21 = (this->m_insideBounds).width;
    fVar23 = (this->m_insideBounds).height;
    (this->m_bounds).left = (this->m_insideBounds).left;
    (this->m_bounds).top = fVar11;
    (this->m_bounds).width = fVar21;
    (this->m_bounds).height = fVar23;
  }
  return;
}

Assistant:

void Shape::updateOutline()
{
    // Return if there is no outline
    if (m_outlineThickness == 0.f)
    {
        m_outlineVertices.clear();
        m_bounds = m_insideBounds;
        return;
    }

    std::size_t count = m_vertices.getVertexCount() - 2;
    m_outlineVertices.resize((count + 1) * 2);

    for (std::size_t i = 0; i < count; ++i)
    {
        std::size_t index = i + 1;

        // Get the two segments shared by the current point
        Vector2f p0 = (i == 0) ? m_vertices[count].position : m_vertices[index - 1].position;
        Vector2f p1 = m_vertices[index].position;
        Vector2f p2 = m_vertices[index + 1].position;

        // Compute their normal
        Vector2f n1 = computeNormal(p0, p1);
        Vector2f n2 = computeNormal(p1, p2);

        // Make sure that the normals point towards the outside of the shape
        // (this depends on the order in which the points were defined)
        if (dotProduct(n1, m_vertices[0].position - p1) > 0)
            n1 = -n1;
        if (dotProduct(n2, m_vertices[0].position - p1) > 0)
            n2 = -n2;

        // Combine them to get the extrusion direction
        float factor = 1.f + (n1.x * n2.x + n1.y * n2.y);
        Vector2f normal = (n1 + n2) / factor;

        // Update the outline points
        m_outlineVertices[i * 2 + 0].position = p1;
        m_outlineVertices[i * 2 + 1].position = p1 + normal * m_outlineThickness;
    }

    // Duplicate the first point at the end, to close the outline
    m_outlineVertices[count * 2 + 0].position = m_outlineVertices[0].position;
    m_outlineVertices[count * 2 + 1].position = m_outlineVertices[1].position;

    // Update outline colors
    updateOutlineColors();

    // Update the shape's bounds
    m_bounds = m_outlineVertices.getBounds();
}